

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale.cpp
# Opt level: O0

string * fs_to_narrow_abi_cxx11_(string *__return_storage_ptr__,wstring_view w)

{
  bool bVar1;
  error_code eVar2;
  error_code local_50;
  string_view local_40;
  string_view local_30;
  undefined1 local_20 [8];
  wstring_view w_local;
  
  w_local._M_len = (size_t)w._M_str;
  local_20 = (undefined1  [8])w._M_len;
  w_local._M_str = (wchar_t *)__return_storage_ptr__;
  bVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::empty
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_20);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"fs_to_narrow");
    eVar2 = std::make_error_code(function_not_supported);
    local_50._M_cat = eVar2._M_cat;
    local_50._M_value = eVar2._M_value;
    fs_print_error(local_30,local_40,&local_50);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_to_narrow(std::wstring_view w)
{
  if(w.empty())
    return {};

  // https://learn.microsoft.com/en-us/windows/win32/api/stringapiset/nf-stringapiset-widechartomultibyte
#if defined(ffilesystem_HAVE_CODECVT)
  // deprecated in C++17, but no STL replacement
  std::wstring_convert<std::codecvt_utf8<wchar_t>> converter;
  return converter.to_bytes(w.data());
#else
  fs_print_error("", __func__, std::make_error_code(std::errc::function_not_supported));
  return {};
#endif

}